

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
                  *this,vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pbVar2;
  bool bVar3;
  MatchResultListener *pMVar4;
  pointer pMVar5;
  unsigned_long uVar6;
  Label *x;
  pointer pMVar7;
  _func_int **pp_Var8;
  bool bVar9;
  long lVar10;
  size_t count;
  long local_228;
  long local_218;
  unsigned_long local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  string local_1e8 [32];
  StringMatchResultListener s;
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  x = (container->
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      )._M_impl.super__Vector_impl_data._M_start;
  local_218 = -(long)x;
  local_228 = 0;
  lVar10 = 0;
  for (uVar6 = 0;
      (local_208 = uVar6,
      x != (container->
           super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
           )._M_impl.super__Vector_impl_data._M_finish &&
      (pMVar5 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar6 != ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x18));
      uVar6 = uVar6 + 1) {
    if (poVar1 == (ostream *)0x0) {
      bVar3 = MatcherBase<const_prometheus::ClientMetric::Label_&>::Matches
                        ((MatcherBase<const_prometheus::ClientMetric::Label_&> *)
                         ((long)&(pMVar5->super_MatcherBase<const_prometheus::ClientMetric::Label_&>
                                 ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         local_228),x);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      bVar3 = MatcherBase<const_prometheus::ClientMetric::Label_&>::MatchAndExplain
                        ((MatcherBase<const_prometheus::ClientMetric::Label_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         local_228),x,&s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((explanations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10),
                 local_1e8);
      std::__cxx11::string::~string(local_1e8);
      StringMatchResultListener::~StringMatchResultListener(&s);
    }
    if (!bVar3) {
      bVar3 = true;
      goto LAB_00126e75;
    }
    x = x + 1;
    local_218 = local_218 + -0x40;
    lVar10 = lVar10 + 0x20;
    local_228 = local_228 + 0x18;
  }
  bVar3 = false;
LAB_00126e75:
  count = ((ulong)((long)&(((container->
                            super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                            )._M_impl.super__Vector_impl_data._M_finish)->name)._M_dataplus._M_p +
                  local_218) >> 6) + uVar6;
  pMVar5 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (count == ((long)pMVar7 - (long)pMVar5) / 0x18) {
    if (!bVar3) {
      bVar3 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar9 = false;
        pp_Var8 = (_func_int **)0x0;
        while (pbVar2 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var8,
              pp_Var8 != (_func_int **)(((long)pMVar7 - (long)pMVar5) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var8]._M_string_length != 0) {
            if (bVar9) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar4 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar4 = MatchResultListener::operator<<(pMVar4,(unsigned_long *)&s);
            pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar4,pbVar2 + (long)pp_Var8);
            pMVar5 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar7 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar9 = true;
          }
          pp_Var8 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1);
        }
      }
      goto LAB_00126f52;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar4 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar4 = MatchResultListener::operator<<(pMVar4,&local_208);
      MatchResultListener::operator<<(pMVar4,(char (*) [15])" doesn\'t match");
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_208,listener->stream_);
    }
  }
  else {
    bVar3 = false;
    if ((poVar1 == (ostream *)0x0) || (bVar3 = false, count == 0)) goto LAB_00126f52;
    pMVar4 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
              *)&s,count);
    MatchResultListener::operator<<(pMVar4,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar3 = false;
LAB_00126f52:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }